

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io_posix.c
# Opt level: O3

char * ethash_io_create_filename(char *dirname,char *filename,size_t filename_length)

{
  ulong uVar1;
  char cVar2;
  size_t sVar3;
  char *dest;
  size_t __size;
  
  sVar3 = strlen(dirname);
  cVar2 = dirname[sVar3];
  uVar1 = sVar3 + 2 + filename_length;
  __size = sVar3 + filename_length + 1;
  if (cVar2 != '/') {
    __size = uVar1;
  }
  dest = (char *)malloc(__size);
  if (dest != (char *)0x0) {
    *dest = '\0';
    ethash_strncat(dest,__size,dirname,sVar3);
    if (cVar2 != '/') {
      sVar3 = strlen(dest);
      if (sVar3 + 2 <= uVar1) {
        sVar3 = strlen(dest);
        (dest + sVar3)[0] = '/';
        (dest + sVar3)[1] = '\0';
      }
    }
    ethash_strncat(dest,__size,filename,filename_length);
  }
  return dest;
}

Assistant:

char* ethash_io_create_filename(
	char const* dirname,
	char const* filename,
	size_t filename_length
)
{
	size_t dirlen = strlen(dirname);
	size_t dest_size = dirlen + filename_length + 1;
	if (dirname[dirlen] != '/') {
		dest_size += 1;
	}
	char* name = malloc(dest_size);
	if (!name) {
		return NULL;
	}

	name[0] = '\0';
	ethash_strncat(name, dest_size, dirname, dirlen);
	if (dirname[dirlen] != '/') {
		ethash_strncat(name, dest_size, "/", 1);
	}
	ethash_strncat(name, dest_size, filename, filename_length);
	return name;
}